

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::C_formatter<spdlog::details::scoped_padder>::format
          (C_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  undefined1 local_58 [8];
  scoped_padder p;
  size_t field_size;
  memory_buf_t *dest_local;
  tm *tm_time_local;
  log_msg *param_1_local;
  C_formatter<spdlog::details::scoped_padder> *this_local;
  
  p.spaces_.size_ = 2;
  scoped_padder::scoped_padder
            ((scoped_padder *)local_58,2,&(this->super_flag_formatter).padinfo_,dest);
  fmt_helper::pad2(tm_time->tm_year % 100,dest);
  scoped_padder::~scoped_padder((scoped_padder *)local_58);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_year % 100, dest);
    }